

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(ReferenceQuadRenderer *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)(&this->m_fragmentBuffer[0].pixelCoord + 6) + lVar2) = 0;
    puVar1 = (undefined8 *)((long)this->m_fragmentBuffer[0].pixelCoord.m_data + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(&this->m_fragmentBuffer[0].pixelCoord + 2) + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&((GenericVec4 *)(&this->m_fragmentBuffer[0].pixelCoord + 3))->v + lVar2 + 4);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0xe000);
  this->m_fragmentBufferSize = 0;
  rr::FragmentProcessor::FragmentProcessor(&this->m_fragmentProcessor);
  memset(this->m_fragmentDepths,0,0x1000);
  return;
}

Assistant:

ReferenceQuadRenderer::ReferenceQuadRenderer (void)
	: m_fragmentBufferSize(0)
{
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_fragmentDepths); i++)
		m_fragmentDepths[i] = 0.0f;
}